

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::MergeSort<long>
               (long *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  uint uVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  ulong uVar2;
  uint local_bc;
  long local_a8;
  long leftElement;
  long rightElement;
  uint32 doubleLength;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 right;
  uint32 mid;
  uint32 left;
  uint32 position;
  uint32 lastSize;
  uint32 bucketSize;
  undefined8 local_68;
  TrackAllocData local_60;
  long *local_38;
  long *buffer;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *compareType;
  ArenaAllocator *allocator_local;
  CompareVarsInfo *cvInfo_local;
  long *plStack_10;
  uint32 length_local;
  long *list_local;
  
  buffer = (long *)cvInfo->compareType;
  compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)allocator;
  allocator_local = (ArenaAllocator *)cvInfo;
  cvInfo_local._4_4_ = length;
  plStack_10 = list;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&long::typeinfo,0,(ulong)length,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
             ,0x1aa1);
  this = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                   (&allocator->
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                    &local_60);
  _lastSize = Memory::ArenaAllocator::Alloc;
  local_68 = 0;
  local_38 = Memory::AllocateArray<Memory::ArenaAllocator,long,false>
                       ((Memory *)this,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)cvInfo_local._4_4_);
  position = 2;
  left = 1;
  j = 0;
  k = 0;
  doubleLength = 0;
  rightElement._4_4_ = 0;
  rightElement._0_4_ = cvInfo_local._4_4_ * 2;
  do {
    mid = 0;
    if ((uint)rightElement <= position) {
      return;
    }
    for (; mid < cvInfo_local._4_4_; mid = position + mid) {
      right = mid;
      i = mid + left;
      if ((i < cvInfo_local._4_4_) &&
         (uVar2 = (*(code *)buffer)(allocator_local,plStack_10 + i,plStack_10 + (i - 1)),
         (uVar2 & 1) != 0)) {
        local_bc = mid + position;
        if (cvInfo_local._4_4_ <= local_bc) {
          local_bc = cvInfo_local._4_4_;
        }
        j = local_bc;
        k = i - 1;
        doubleLength = 0;
        rightElement._4_4_ = i;
        while (rightElement._4_4_ < local_bc) {
          local_38[doubleLength] = plStack_10[rightElement._4_4_];
          rightElement._4_4_ = rightElement._4_4_ + 1;
          doubleLength = doubleLength + 1;
        }
        doubleLength = doubleLength - 1;
        leftElement = local_38[doubleLength];
        local_a8 = plStack_10[k];
LAB_0110ded2:
        uVar2 = (*(code *)buffer)(allocator_local,&leftElement,&local_a8);
        if ((uVar2 & 1) == 0) {
          plStack_10[rightElement._4_4_ - 1] = leftElement;
          uVar1 = rightElement._4_4_ - 1;
          if (doubleLength == 0) goto LAB_0110dfb7;
          doubleLength = doubleLength - 1;
          leftElement = local_38[doubleLength];
LAB_0110dfb0:
          rightElement._4_4_ = rightElement._4_4_ - 1;
          goto LAB_0110ded2;
        }
        plStack_10[rightElement._4_4_ - 1] = local_a8;
        if (right < k) {
          k = k - 1;
          local_a8 = plStack_10[k];
          goto LAB_0110dfb0;
        }
        plStack_10[rightElement._4_4_ - 2] = leftElement;
        uVar1 = rightElement._4_4_ - 2;
LAB_0110dfb7:
        while (rightElement._4_4_ = uVar1, doubleLength != 0) {
          doubleLength = doubleLength - 1;
          plStack_10[rightElement._4_4_ - 1] = local_38[doubleLength];
          uVar1 = rightElement._4_4_ - 1;
        }
      }
    }
    left = position;
    position = position << 1;
  } while( true );
}

Assistant:

void JavascriptArray::MergeSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        T* buffer = AnewArray(allocator, T, length);
        uint32 bucketSize = 2, lastSize = 1, position = 0, left = 0, mid = 0, right = 0, i = 0, j = 0, k = 0;
        uint32 doubleLength = length + length;
        T rightElement, leftElement;

        while (bucketSize < doubleLength)
        {
            while (position < length)
            {
                left = position;
                mid = left + lastSize;

                // perform a merge but only if it's necessary
                if (mid < length && compareType (cvInfo, &list[mid], &list[mid - 1]))
                {
                    right = position + bucketSize;
                    right = right < length ? right : length;
                    i = mid - 1, j = 0, k = mid;

                    while (k < right)
                    {
                        buffer[j++] = list[k++];
                    }
    
                    rightElement = buffer[--j];
                    leftElement = list[i];

                    for (;;)
                    {
                        if (compareType (cvInfo, &rightElement, &leftElement))
                        {
                            list[--k] = leftElement;
                            if (i > left)
                            {
                                leftElement = list[--i];
                            }
                            else
                            {
                                list[--k] = rightElement;
                                break;
                            }
                        }
                        else
                        {
                            list[--k] = rightElement;
                            if (j > 0)
                            {
                                rightElement = buffer[--j];
                            }
                            else
                            {
                                break;
                            }
                        }
                    }

                    while (j > 0)
                    {
                        list[--k] = buffer[--j];
                    }
                }  
                position += bucketSize;
            }
            position = 0;
            lastSize = bucketSize;
            bucketSize *= 2;
        }
    }